

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O2

void __thiscall
QStyledItemDelegate::updateEditorGeometry
          (QStyledItemDelegate *this,QWidget *editor,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  long lVar1;
  QWidget *this_00;
  int iVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QRect local_118;
  QStyleOptionViewItem opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (editor != (QWidget *)0x0) {
    this_00 = option->widget;
    memset(&opt,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&opt,option);
    (**(code **)(*(long *)this + 0xb8))(this,&opt,index);
    pQVar3 = QWidget::style(editor);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x3c,0,editor,0);
    opt.showDecorationSelected = iVar2 != 0;
    if (this_00 == (QWidget *)0x0) {
      pQVar3 = QApplication::style();
    }
    else {
      pQVar3 = QWidget::style(this_00);
    }
    local_118 = (QRect)(**(code **)(*(long *)pQVar3 + 0xc0))(pQVar3,0x2e,&opt,this_00);
    QWidget::setGeometry(editor,&local_118);
    QStyleOptionViewItem::~QStyleOptionViewItem(&opt);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyledItemDelegate::updateEditorGeometry(QWidget *editor,
                                         const QStyleOptionViewItem &option,
                                         const QModelIndex &index) const
{
    if (!editor)
        return;
    Q_ASSERT(index.isValid());
    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);

    QStyleOptionViewItem opt = option;
    initStyleOption(&opt, index);
    opt.showDecorationSelected = editor->style()->styleHint(QStyle::SH_ItemView_ShowDecorationSelected, nullptr, editor);

    QStyle *style = widget ? widget->style() : QApplication::style();
    QRect geom = style->subElementRect(QStyle::SE_ItemViewItemText, &opt, widget);
    editor->setGeometry(geom);
}